

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

void __thiscall QMetaType::QMetaType(QMetaType *this,int typeId)

{
  QMetaTypeInterface *pQVar1;
  long in_FS_OFFSET;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = interfaceForTypeNoWarning(typeId);
  if (typeId != 0 && pQVar1 == (QMetaTypeInterface *)0x0) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    QMessageLogger::warning
              (&local_40,"Trying to construct an instance of an invalid type, type id: %i",typeId);
  }
  this->d_ptr = pQVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMetaType::QMetaType(int typeId) : QMetaType(interfaceForType(typeId)) {}